

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O1

void burstsort2_sampling_superalphabet_vector_block(uchar **strings,size_t n)

{
  uchar *puVar1;
  pointer ppvVar2;
  ulong uVar3;
  bool bVar4;
  ushort uVar5;
  ostream *poVar6;
  TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> *root;
  undefined8 *puVar7;
  TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> *this;
  _func_void_uchar_ptr_ptr_int_int *in_RCX;
  long lVar8;
  ulong uVar9;
  uint index;
  long lVar11;
  ulong uVar10;
  
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"pseudo_sample",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(): sampling ",0xd);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," strings ...\n",0xd);
  root = (TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> *)operator_new(0x18);
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (n != 0) {
    lVar8 = 2000;
    uVar9 = 0;
    do {
      puVar1 = strings[uVar9];
      if (puVar1 == (uchar *)0x0) {
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      lVar11 = 0;
      this = root;
      do {
        if (puVar1[lVar11] == '\0') {
          uVar5 = 0;
        }
        else {
          uVar5 = CONCAT11(puVar1[lVar11],puVar1[lVar11 + 1]);
        }
        if ((char)uVar5 == '\0') {
          in_RCX = (_func_void_uchar_ptr_ptr_int_int *)0x6;
          bVar4 = false;
        }
        else {
          index = (uint)uVar5;
          uVar10 = (ulong)index;
          if ((ulong)((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) < (ulong)(index + 1)) {
            std::vector<void_*,_std::allocator<void_*>_>::resize(&this->_buckets,(ulong)(index + 1))
            ;
          }
          lVar11 = lVar11 + 2;
          ppvVar2 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (((ulong)((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppvVar2 >> 3) <=
               uVar10) || (((ulong)ppvVar2[uVar10] & 1) == 0)) {
            puVar7 = (undefined8 *)operator_new(0x18);
            *puVar7 = 0;
            puVar7[1] = 0;
            puVar7[2] = 0;
            *(undefined8 **)
             ((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start + (ulong)(index * 8)) = puVar7;
            ppvVar2 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar3 = *(ulong *)((long)ppvVar2 + (ulong)(index * 8));
            if (uVar3 == 0) {
              __assert_fail("ptr",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                            ,0x5c,"void make_trie(void *&)");
            }
            ppvVar2[uVar10] = (void *)(uVar3 | 1);
            lVar8 = lVar8 + -1;
            if (lVar8 == 0) {
              bVar4 = false;
              in_RCX = (_func_void_uchar_ptr_ptr_int_int *)0x7;
              lVar8 = 0;
              goto LAB_0021140c;
            }
          }
          this = TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_>::get_node
                           (this,index);
          if (this == (TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> *)0x0) {
            __assert_fail("node",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                          ,0xd9,
                          "TrieNode<CharT, BucketT> *pseudo_sample(unsigned char **, size_t) [CharT = unsigned short, BucketT = vector_block<unsigned char *, 128>]"
                         );
          }
          in_RCX = (_func_void_uchar_ptr_ptr_int_int *)0x0;
          bVar4 = true;
        }
LAB_0021140c:
      } while ((int)in_RCX == 0);
      if ((int)in_RCX == 6) {
        bVar4 = true;
      }
      uVar9 = uVar9 + 0x2000;
    } while ((uVar9 < n) && (bVar4));
  }
  insert<32768u,vector_block<unsigned_char*,128u>,BurstSimple<unsigned_short>,unsigned_short>
            (root,strings,n);
  traverse<void(*)(unsigned_char**,int,int),vector_block<unsigned_char*,128u>,unsigned_short>
            (root,strings,0,in_RCX);
  return;
}

Assistant:

void burstsort2_sampling_superalphabet_vector_block(unsigned char** strings, size_t n)
{
	typedef uint16_t CharT;
	typedef vector_block<unsigned char*, 128> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = pseudo_sample<CharT, BucketT>(strings, n);
	insert<32768, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}